

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O2

ZCC_Expression * __thiscall
ZCCCompiler::SimplifyFunctionCall(ZCCCompiler *this,ZCC_ExprFuncCall *callop)

{
  PType *target;
  ZCC_Expression *pZVar1;
  char *msg;
  int iVar2;
  ZCC_FuncParm *pZVar3;
  Conversion *route [8];
  
  pZVar1 = Simplify(this,callop->Function);
  callop->Function = pZVar1;
  pZVar3 = callop->Parameters;
  if (pZVar3 == (ZCC_FuncParm *)0x0) {
    if (pZVar1->Operation != PEX_TypeRef) {
      return &callop->super_ZCC_Expression;
    }
  }
  else {
    iVar2 = 1;
    do {
      if ((pZVar3->super_ZCC_TreeNode).NodeType != AST_FuncParm) {
        __assert_fail("parm->NodeType == AST_FuncParm",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                      ,0x16f,"ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)"
                     );
      }
      pZVar1 = Simplify(this,pZVar3->Value);
      pZVar3->Value = pZVar1;
      pZVar3 = (ZCC_FuncParm *)(pZVar3->super_ZCC_TreeNode).SiblingNext;
      iVar2 = iVar2 + -1;
    } while (pZVar3 != callop->Parameters);
    if (callop->Function->Operation != PEX_TypeRef) {
      return &callop->super_ZCC_Expression;
    }
    if (iVar2 == 0) {
      target = (PType *)callop->Function[1].super_ZCC_TreeNode.SiblingNext;
      iVar2 = PType::FindConversion(pZVar3->Value->Type,target,route,8);
      if (-1 < iVar2) {
        pZVar1 = pZVar3->Value;
        ApplyConversion(this,pZVar1,route,iVar2);
        if (pZVar1->Type == target) {
          return pZVar1;
        }
        __assert_fail("val->Type == dest",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                      ,0x18c,"ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *)"
                     );
      }
      msg = "Cannot convert type 1 to type 2";
      goto LAB_00603091;
    }
  }
  msg = "Type cast requires one parameter";
LAB_00603091:
  Error(this,(ZCC_TreeNode *)callop,msg);
  (callop->super_ZCC_Expression).Type = &TypeError->super_PType;
  *(undefined8 *)&(callop->super_ZCC_Expression).super_ZCC_TreeNode.NodeType = 0x14;
  return &callop->super_ZCC_Expression;
}

Assistant:

ZCC_Expression *ZCCCompiler::SimplifyFunctionCall(ZCC_ExprFuncCall *callop)
{
	ZCC_FuncParm *parm;
	int parmcount = 0;

	callop->Function = Simplify(callop->Function);
	parm = callop->Parameters;
	if (parm != NULL)
	{
		do
		{
			parmcount++;
			assert(parm->NodeType == AST_FuncParm);
			parm->Value = Simplify(parm->Value);
			parm = static_cast<ZCC_FuncParm *>(parm->SiblingNext);
		}
		while (parm != callop->Parameters);
	}
	// If the left side is a type ref, then this is actually a cast
	// and not a function call.
	if (callop->Function->Operation == PEX_TypeRef)
	{
		if (parmcount != 1)
		{
			Error(callop, "Type cast requires one parameter");
			callop->ToErrorNode();
		}
		else
		{
			PType *dest = static_cast<ZCC_ExprTypeRef *>(callop->Function)->RefType;
			const PType::Conversion *route[CONVERSION_ROUTE_SIZE];
			int routelen = parm->Value->Type->FindConversion(dest, route, countof(route));
			if (routelen < 0)
			{
				///FIXME: Need real type names
				Error(callop, "Cannot convert type 1 to type 2");
				callop->ToErrorNode();
			}
			else
			{
				ZCC_Expression *val = ApplyConversion(parm->Value, route, routelen);
				assert(val->Type == dest);
				return val;
			}
		}
	}
	return callop;
}